

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O1

void MpiReleaseTimeStep(CP_Services Svcs,DP_WS_Stream Stream_v,size_t TimeStep)

{
  pthread_rwlock_t *__rwlock;
  size_t sVar1;
  size_t *psVar2;
  size_t *psVar3;
  size_t *__ptr;
  
  (*Svcs->verbose)(*Stream_v,5,"Releasing timestep %ld\n",TimeStep);
  __rwlock = (pthread_rwlock_t *)((long)Stream_v + 0x40);
  pthread_rwlock_rdlock(__rwlock);
  psVar3 = (size_t *)((long)Stream_v + 0x20);
  __ptr = *(size_t **)((long)Stream_v + 0x20);
  pthread_rwlock_unlock(__rwlock);
  if ((__ptr == (size_t *)0x0) || (*__ptr != TimeStep)) {
    pthread_rwlock_rdlock(__rwlock);
    for (__ptr = (size_t *)*psVar3; __ptr != (size_t *)0x0; __ptr = (size_t *)__ptr[2]) {
      if (*__ptr == TimeStep) {
        pthread_rwlock_unlock(__rwlock);
        pthread_rwlock_wrlock(__rwlock);
        psVar2 = (size_t *)*psVar3;
        if (psVar2 != __ptr) goto LAB_0011d4da;
        goto LAB_0011d4f9;
      }
    }
    __ptr = (size_t *)0x0;
    goto LAB_0011d50a;
  }
  pthread_rwlock_wrlock(__rwlock);
  psVar2 = (size_t *)*psVar3;
LAB_0011d4f9:
  sVar1 = psVar2[2];
  *psVar3 = sVar1;
  if (sVar1 != 0) goto LAB_0011d50a;
  goto LAB_0011d506;
LAB_0011d4da:
  do {
    psVar3 = psVar2;
    psVar2 = (size_t *)psVar3[2];
  } while (psVar2 != __ptr);
  sVar1 = psVar2[2];
  psVar3[2] = sVar1;
  if (sVar1 != 0) goto LAB_0011d50a;
  psVar3 = psVar3 + 2;
LAB_0011d506:
  *(size_t **)((long)Stream_v + 0x28) = psVar3;
LAB_0011d50a:
  pthread_rwlock_unlock(__rwlock);
  if (__ptr != (size_t *)0x0) {
    free((void *)__ptr[1]);
    free(__ptr);
    return;
  }
  return;
}

Assistant:

static void MpiReleaseTimeStep(CP_Services Svcs, DP_WS_Stream Stream_v, size_t TimeStep)
{
    MpiStreamWR Stream = (MpiStreamWR)Stream_v;

    Svcs->verbose(Stream->Stream.CP_Stream, DPTraceVerbose, "Releasing timestep %ld\n", TimeStep);

    pthread_rwlock_rdlock(&Stream->LockTS);
    TimeStepsEntry EntryToDelete = STAILQ_FIRST(&Stream->TimeSteps);
    pthread_rwlock_unlock(&Stream->LockTS);

    // Optimal pathway
    if (EntryToDelete && EntryToDelete->TimeStep == TimeStep)
    {
        pthread_rwlock_wrlock(&Stream->LockTS);
        STAILQ_REMOVE_HEAD(&Stream->TimeSteps, entries);
        pthread_rwlock_unlock(&Stream->LockTS);
    }
    else // General pathway
    {
        EntryToDelete = NULL;

        pthread_rwlock_rdlock(&Stream->LockTS);
        STAILQ_FOREACH(EntryToDelete, &Stream->TimeSteps, entries)
        {
            if (EntryToDelete->TimeStep == TimeStep)
            {
                break;
            }
        }
        pthread_rwlock_unlock(&Stream->LockTS);
        if (EntryToDelete)
        {
            pthread_rwlock_wrlock(&Stream->LockTS);
            STAILQ_REMOVE(&Stream->TimeSteps, EntryToDelete, _TimeStepsEntry, entries);
            pthread_rwlock_unlock(&Stream->LockTS);
        }
    }

    if (EntryToDelete)
    {
        free(EntryToDelete->Data);
        free(EntryToDelete);
    }
}